

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

MatrixXd * __thiscall OpenNN::Layer::to_matrix_derivated(Layer *this)

{
  Matrix<double,_1,_1,0,_1,_1> *this_00;
  size_type sVar1;
  reference ppNVar2;
  Scalar *pSVar3;
  double dVar4;
  int local_38;
  int i;
  size_type local_28;
  int local_1c;
  Matrix<double,_1,_1,0,_1,_1> *local_18;
  MatrixXd *matrix;
  Layer *this_local;
  
  matrix = (MatrixXd *)this;
  this_00 = (Matrix<double,_1,_1,0,_1,_1> *)operator_new(0x18);
  local_1c = 1;
  local_28 = std::vector<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>::size(&this->neurons);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>(this_00,&local_1c,&local_28);
  local_38 = 0;
  local_18 = this_00;
  while( true ) {
    sVar1 = std::vector<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>::size(&this->neurons);
    if (sVar1 <= (ulong)(long)local_38) break;
    ppNVar2 = std::vector<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>::at
                        (&this->neurons,(long)local_38);
    dVar4 = Neuron::get_derivated_value(*ppNVar2);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_18,0,
                        (long)local_38);
    *pSVar3 = dVar4;
    local_38 = local_38 + 1;
  }
  return (MatrixXd *)local_18;
}

Assistant:

Eigen::MatrixXd* OpenNN::Layer::to_matrix_derivated()
{
    Eigen::MatrixXd* matrix = new Eigen::MatrixXd(1, this->neurons.size());
    for (int i = 0; i < this->neurons.size(); i++) {
        (*matrix)(0, i) = this->neurons.at(i)->get_derivated_value();
    }
    return matrix;
}